

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t
zesGetSchedulerProcAddrTable(ze_api_version_t version,zes_scheduler_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (zes_scheduler_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnGetProperties = driver::zesSchedulerGetProperties;
      pDdiTable->pfnGetCurrentMode = driver::zesSchedulerGetCurrentMode;
      pDdiTable->pfnGetTimeoutModeProperties = driver::zesSchedulerGetTimeoutModeProperties;
      pDdiTable->pfnGetTimesliceModeProperties = driver::zesSchedulerGetTimesliceModeProperties;
      pDdiTable->pfnSetTimeoutMode = driver::zesSchedulerSetTimeoutMode;
      pDdiTable->pfnSetTimesliceMode = driver::zesSchedulerSetTimesliceMode;
      pDdiTable->pfnSetExclusiveMode = driver::zesSchedulerSetExclusiveMode;
      pDdiTable->pfnSetComputeUnitDebugMode = driver::zesSchedulerSetComputeUnitDebugMode;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetSchedulerProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_scheduler_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGetProperties                          = driver::zesSchedulerGetProperties;

    pDdiTable->pfnGetCurrentMode                         = driver::zesSchedulerGetCurrentMode;

    pDdiTable->pfnGetTimeoutModeProperties               = driver::zesSchedulerGetTimeoutModeProperties;

    pDdiTable->pfnGetTimesliceModeProperties             = driver::zesSchedulerGetTimesliceModeProperties;

    pDdiTable->pfnSetTimeoutMode                         = driver::zesSchedulerSetTimeoutMode;

    pDdiTable->pfnSetTimesliceMode                       = driver::zesSchedulerSetTimesliceMode;

    pDdiTable->pfnSetExclusiveMode                       = driver::zesSchedulerSetExclusiveMode;

    pDdiTable->pfnSetComputeUnitDebugMode                = driver::zesSchedulerSetComputeUnitDebugMode;

    return result;
}